

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ResumeIdleDecommit
          (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  DWORD DVar5;
  ThreadContextId pvVar6;
  undefined8 *in_FS_OFFSET;
  
  if (this->idleDecommitEnterCount != 0) {
    return;
  }
  iVar4 = (*this->_vptr_PageAllocatorBase[2])();
  if ((char)iVar4 == '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x77e,"(this->IsIdleDecommitPageAllocator())",
                       "this->IsIdleDecommitPageAllocator()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  bVar3 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if ((bVar3) && (this->pageAllocatorFlagTable->Verbose == true)) {
    pvVar6 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar5 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar6,(ulong)DVar5,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"ResumeIdleDecommit");
    Output::Print(L"\n");
    Output::Flush();
  }
  CCLock::Leave((CCLock *)&this[1].disableThreadAccessCheck);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ResumeIdleDecommit()
{
#ifdef IDLE_DECOMMIT_ENABLED
    if (this->idleDecommitEnterCount != 0)
    {
        return;
    }
    Assert(this->IsIdleDecommitPageAllocator());
    PAGE_ALLOC_VERBOSE_TRACE(_u("ResumeIdleDecommit"));
    ((IdleDecommitPageAllocator *)this)->cs.Leave();
#endif
}